

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorspace.h
# Opt level: O0

RGB __thiscall pbrt::RGBColorSpace::ToRGB(RGBColorSpace *this,XYZ *xyz)

{
  undefined8 uVar1;
  XYZ *in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar3 [56];
  RGB RVar4;
  SquareMatrix<3> *in_stack_fffffffffffffff0;
  undefined1 auVar2 [64];
  
  auVar3 = in_ZMM0._8_56_;
  RVar4 = Mul<pbrt::RGB,3,pbrt::XYZ>(in_stack_fffffffffffffff0,in_RDI);
  auVar2._0_8_ = RVar4._0_8_;
  auVar2._8_56_ = auVar3;
  uVar1 = vmovlpd_avx(auVar2._0_16_);
  RVar4.b = RVar4.b;
  RVar4.r = (Float)(int)uVar1;
  RVar4.g = (Float)(int)((ulong)uVar1 >> 0x20);
  return RVar4;
}

Assistant:

PBRT_CPU_GPU
    RGB ToRGB(const XYZ &xyz) const { return Mul<RGB>(RGBFromXYZ, xyz); }